

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

Aig_Man_t *
LivenessToSafetyTransformation
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Aig_Obj_t *pAVar10;
  char *pcVar11;
  ulong uVar12;
  Aig_Obj_t *pAVar13;
  Aig_Obj_t *pAVar14;
  Aig_Obj_t *p0;
  Aig_Obj_t *pAVar15;
  Aig_Obj_t *pAVar16;
  long lVar17;
  Aig_Obj_t *pAVar18;
  int iVar19;
  int iVar20;
  Aig_Obj_t *local_70;
  Aig_Obj_t *local_68;
  Aig_Obj_t *local_58;
  Aig_Obj_t *local_48;
  Aig_Obj_t *local_40;
  
  uVar5 = p->nTruePis;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar19 = 8;
  if (6 < uVar5) {
    iVar19 = uVar5 + 1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar19;
  if (iVar19 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar19 * 8);
  }
  pVVar6->pArray = ppvVar7;
  vecPis = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar19;
  if (iVar19 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar19 << 3);
  }
  pVVar6->pArray = ppvVar7;
  iVar4 = p->nRegs * 2 + vLive->nSize;
  iVar19 = vFair->nSize;
  vecPiNames = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar20 = 8;
  if (6 < (uint)(iVar4 + iVar19)) {
    iVar20 = iVar19 + iVar4 + 1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar20;
  if (iVar20 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar20 * 8);
  }
  pVVar6->pArray = ppvVar7;
  vecLos = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar20;
  if (iVar20 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar20 << 3);
  }
  pVVar6->pArray = ppvVar7;
  vecLoNames = pVVar6;
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar11 = pNtk->pName;
  sVar8 = strlen(pcVar11);
  pcVar9 = (char *)malloc(sVar8 + 5);
  p_00->pName = pcVar9;
  sprintf(pcVar9,"%s_%s",pcVar11,"l2s");
  p_00->pSpec = (char *)0x0;
  pAVar13 = p->pConst1;
  pAVar13->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar17 = 0;
    do {
      if (p->vCis->nSize <= lVar17) goto LAB_005a48d8;
      pAVar13 = (Aig_Obj_t *)p->vCis->pArray[lVar17];
      pAVar10 = Aig_ObjCreateCi(p_00);
      (pAVar13->field_5).pData = pAVar10;
      pVVar6 = vecPis;
      uVar5 = vecPis->nCap;
      if (vecPis->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecPis->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar19 = 0x10;
        }
        else {
          iVar19 = uVar5 * 2;
          if (iVar19 <= (int)uVar5) goto LAB_005a3819;
          if (vecPis->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecPis->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar19;
      }
LAB_005a3819:
      iVar19 = pVVar6->nSize;
      pVVar6->nSize = iVar19 + 1;
      pVVar6->pArray[iVar19] = pAVar10;
      if (pNtk->vPis->nSize <= lVar17) goto LAB_005a48d8;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vPis->pArray[lVar17]);
      if (pcVar11 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar11);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar11);
      }
      pVVar6 = vecPiNames;
      uVar5 = vecPiNames->nCap;
      if (vecPiNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecPiNames->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar19 = 0x10;
        }
        else {
          iVar19 = uVar5 * 2;
          if (iVar19 <= (int)uVar5) goto LAB_005a38ef;
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar19;
      }
LAB_005a38ef:
      iVar19 = pVVar6->nSize;
      pVVar6->nSize = iVar19 + 1;
      pVVar6->pArray[iVar19] = pcVar9;
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nTruePis);
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_70 = Aig_ObjCreateCi(p_00);
    pVVar6 = vecPiNames;
    uVar5 = vecPiNames->nCap;
    if (vecPiNames->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vecPiNames->pArray,0x80);
        }
        pVVar6->pArray = ppvVar7;
        iVar19 = 0x10;
      }
      else {
        iVar19 = uVar5 * 2;
        if (iVar19 <= (int)uVar5) goto LAB_005a39b5;
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
        }
        pVVar6->pArray = ppvVar7;
      }
      pVVar6->nCap = iVar19;
    }
LAB_005a39b5:
    iVar19 = pVVar6->nSize;
    pVVar6->nSize = iVar19 + 1;
    pVVar6->pArray[iVar19] = "SAVE_BIERE";
  }
  else {
    local_70 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar19 = 0;
    do {
      uVar5 = p->nTruePis + iVar19;
      if (((int)uVar5 < 0) || (p->vCis->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pAVar13 = (Aig_Obj_t *)p->vCis->pArray[uVar5];
      pAVar10 = Aig_ObjCreateCi(p_00);
      (pAVar13->field_5).pData = pAVar10;
      pVVar6 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar5 * 2;
          if (iVar20 <= (int)uVar5) goto LAB_005a3a8a;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar20;
      }
LAB_005a3a8a:
      iVar20 = pVVar6->nSize;
      pVVar6->nSize = iVar20 + 1;
      pVVar6->pArray[iVar20] = pAVar10;
      uVar5 = pNtk->vPis->nSize + iVar19;
      if (((int)uVar5 < 0) || (pNtk->vCis->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar5]);
      if (pcVar11 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar11);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar11);
      }
      pVVar6 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar5 * 2;
          if (iVar20 <= (int)uVar5) goto LAB_005a3b6d;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar20;
      }
LAB_005a3b6d:
      iVar20 = pVVar6->nSize;
      pVVar6->nSize = iVar20 + 1;
      pVVar6->pArray[iVar20] = pcVar9;
      iVar19 = iVar19 + 1;
    } while (iVar19 < p->nRegs);
  }
  if ((mode & 0xfffffffdU) == 0) {
    pAVar10 = Aig_ObjCreateCi(p_00);
    pVVar6 = vecLos;
    uVar5 = vecLos->nCap;
    if (vecLos->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vecLos->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vecLos->pArray,0x80);
        }
        pVVar6->pArray = ppvVar7;
        iVar19 = 0x10;
      }
      else {
        iVar19 = uVar5 * 2;
        if (iVar19 <= (int)uVar5) goto LAB_005a3c29;
        if (vecLos->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
        }
        pVVar6->pArray = ppvVar7;
      }
      pVVar6->nCap = iVar19;
    }
LAB_005a3c29:
    iVar19 = pVVar6->nSize;
    pVVar6->nSize = iVar19 + 1;
    pVVar6->pArray[iVar19] = pAVar10;
    pVVar6 = vecLoNames;
    uVar5 = vecLoNames->nCap;
    if (vecLoNames->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vecLoNames->pArray,0x80);
        }
        pVVar6->pArray = ppvVar7;
        iVar19 = 0x10;
      }
      else {
        iVar19 = uVar5 * 2;
        if (iVar19 <= (int)uVar5) goto LAB_005a3cb8;
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
        }
        pVVar6->pArray = ppvVar7;
      }
      pVVar6->nCap = iVar19;
    }
LAB_005a3cb8:
    iVar19 = pVVar6->nSize;
    pVVar6->nSize = iVar19 + 1;
    pVVar6->pArray[iVar19] = "SAVED_LO";
  }
  else {
    pAVar10 = (Aig_Obj_t *)0x0;
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_58 = Aig_Or(p_00,local_70,pAVar10);
    local_68 = Aig_And(p_00,local_70,(Aig_Obj_t *)((ulong)pAVar10 ^ 1));
  }
  else {
    local_68 = (Aig_Obj_t *)0x0;
    local_58 = (Aig_Obj_t *)0x0;
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar17 = 0;
    do {
      pAVar13 = (Aig_Obj_t *)pVVar6->pArray[lVar17];
      if ((pAVar13 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar13->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar13 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar12 = (ulong)pAVar13->pFanin0 & 0xfffffffffffffffe;
        if (uVar12 == 0) {
          pAVar18 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar18 = (Aig_Obj_t *)((ulong)((uint)pAVar13->pFanin0 & 1) ^ *(ulong *)(uVar12 + 0x28));
        }
        uVar12 = (ulong)pAVar13->pFanin1 & 0xfffffffffffffffe;
        if (uVar12 == 0) {
          pAVar16 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar16 = (Aig_Obj_t *)((ulong)((uint)pAVar13->pFanin1 & 1) ^ *(ulong *)(uVar12 + 0x28));
        }
        pAVar18 = Aig_And(p_00,pAVar18,pAVar16);
        (pAVar13->field_5).pData = pAVar18;
      }
      lVar17 = lVar17 + 1;
      pVVar6 = p->vObjs;
    } while (lVar17 < pVVar6->nSize);
  }
  if ((uint)mode < 2) {
    if (vAssertSafety->nSize == 0) {
LAB_005a3e41:
      puts("WARNING!! No safety property is found, a new (negated) constant 1 output is created");
      pAVar18 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
    }
    else if (vAssumeSafety->nSize == 0) {
      pAVar18 = p_00->pConst1;
      if (0 < vAssertSafety->nSize) {
        lVar17 = 0;
        do {
          pAVar13 = (Aig_Obj_t *)vAssertSafety->pArray[lVar17];
          pAVar18 = Aig_And(p_00,(Aig_Obj_t *)
                                 ((ulong)((uint)pAVar13->pFanin0 & 1) ^
                                 *(ulong *)(((ulong)pAVar13->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                            pAVar18);
          lVar17 = lVar17 + 1;
        } while (lVar17 < vAssertSafety->nSize);
      }
      pAVar18 = (Aig_Obj_t *)((ulong)pAVar18 ^ 1);
    }
    else {
      if ((vAssertSafety->nSize == 0) || (vAssumeSafety->nSize == 0)) goto LAB_005a3e41;
      pAVar18 = p_00->pConst1;
      if (0 < vAssertSafety->nSize) {
        lVar17 = 0;
        do {
          pAVar13 = (Aig_Obj_t *)vAssertSafety->pArray[lVar17];
          pAVar18 = Aig_And(p_00,(Aig_Obj_t *)
                                 ((ulong)((uint)pAVar13->pFanin0 & 1) ^
                                 *(ulong *)(((ulong)pAVar13->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                            pAVar18);
          lVar17 = lVar17 + 1;
        } while (lVar17 < vAssertSafety->nSize);
      }
      pAVar16 = p_00->pConst1;
      if (0 < vAssumeSafety->nSize) {
        lVar17 = 0;
        do {
          pAVar13 = (Aig_Obj_t *)vAssumeSafety->pArray[lVar17];
          pAVar16 = Aig_And(p_00,(Aig_Obj_t *)
                                 ((ulong)((uint)pAVar13->pFanin0 & 1) ^
                                 *(ulong *)(((ulong)pAVar13->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                            pAVar16);
          lVar17 = lVar17 + 1;
        } while (lVar17 < vAssumeSafety->nSize);
      }
      pAVar18 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar18 ^ 1),pAVar16);
    }
    Aig_ObjCreateCo(p_00,pAVar18);
  }
  iVar19 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    local_40 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                     (((ulong)pAVar13->pFanin0 & 0xfffffffffffffffe) + 0x28));
  }
  else {
    local_40 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar19 = 0;
    do {
      iVar20 = p->nTruePis;
      uVar5 = iVar19 + iVar20;
      if (((int)uVar5 < 0) || (p->vCis->nSize <= (int)uVar5)) goto LAB_005a48d8;
      piVar2 = (int *)p->vCis->pArray[uVar5];
      if (((piVar2[6] & 7U) != 2) || (iVar4 = *piVar2, iVar4 < iVar20)) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar5 = (iVar4 - iVar20) + p->nTruePos;
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar5)) goto LAB_005a48d8;
      uVar12 = *(ulong *)((long)p->vCos->pArray[uVar5] + 8);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)uVar12 & 1) ^
                           *(ulong *)((uVar12 & 0xfffffffffffffffe) + 0x28)));
      iVar19 = iVar19 + 1;
    } while (iVar19 < p->nRegs);
  }
  if ((mode & 0xfffffffdU) != 0) {
    local_48 = (Aig_Obj_t *)0x0;
    iVar20 = 1;
    iVar4 = 0;
    goto LAB_005a477a;
  }
  local_48 = Aig_ObjCreateCo(p_00,local_58);
  pAVar13 = p_00->pConst1;
  iVar19 = iVar19 + 1;
  if (0 < p->nRegs) {
    iVar20 = 0;
    do {
      uVar5 = p->nTruePis + iVar20;
      if (((int)uVar5 < 0) || (p->vCis->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pvVar3 = p->vCis->pArray[uVar5];
      pAVar18 = Aig_ObjCreateCi(p_00);
      pVVar6 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar5 * 2;
          if (iVar4 <= (int)uVar5) goto LAB_005a4085;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar4;
      }
LAB_005a4085:
      iVar4 = pVVar6->nSize;
      pVVar6->nSize = iVar4 + 1;
      pVVar6->pArray[iVar4] = pAVar18;
      uVar5 = pNtk->vPis->nSize + iVar20;
      if (((int)uVar5 < 0) || (pNtk->vCis->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar5]);
      sVar8 = strlen(pcVar11);
      pcVar11 = (char *)malloc(sVar8 + 10);
      uVar5 = pNtk->vPis->nSize + iVar20;
      if (((int)uVar5 < 0) || (pNtk->vCis->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar5]);
      sprintf(pcVar11,"%s__%s",pcVar9,"SHADOW");
      pVVar6 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar5 * 2;
          if (iVar4 <= (int)uVar5) goto LAB_005a4194;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar4;
      }
LAB_005a4194:
      iVar4 = pVVar6->nSize;
      pVVar6->nSize = iVar4 + 1;
      pVVar6->pArray[iVar4] = pcVar11;
      pAVar16 = Aig_Mux(p_00,local_68,*(Aig_Obj_t **)((long)pvVar3 + 0x28),pAVar18);
      Aig_ObjCreateCo(p_00,pAVar16);
      pAVar18 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pvVar3 + 0x28),pAVar18);
      pAVar13 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar18 ^ 1),pAVar13);
      iVar20 = iVar20 + 1;
    } while (iVar20 < p->nRegs);
    iVar19 = iVar19 + iVar20;
  }
  pAVar18 = Aig_And(p_00,pAVar10,pAVar13);
  pAVar13 = p_00->pConst1;
  if ((vLive == (Vec_Ptr_t *)0x0) || (vLive->nSize == 0)) {
    puts("Circuit without any liveness property");
LAB_005a44a5:
    iVar20 = 1;
  }
  else {
    if (vLive->nSize < 1) goto LAB_005a44a5;
    lVar17 = 0;
    do {
      pAVar16 = (Aig_Obj_t *)vLive->pArray[lVar17];
      pAVar15 = pAVar16->pFanin0;
      uVar12 = *(ulong *)(((ulong)pAVar15 & 0xfffffffffffffffe) + 0x28);
      pAVar14 = Aig_ObjCreateCi(p_00);
      pVVar6 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar5 * 2;
          if (iVar20 <= (int)uVar5) goto LAB_005a42ea;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar20;
      }
LAB_005a42ea:
      iVar20 = pVVar6->nSize;
      pVVar6->nSize = iVar20 + 1;
      pVVar6->pArray[iVar20] = pAVar14;
      uVar5 = getPoIndex(p,pAVar16);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sVar8 = strlen(pcVar11);
      pcVar11 = (char *)malloc(sVar8 + 0xc);
      uVar5 = getPoIndex(p,pAVar16);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sprintf(pcVar11,"%s__%s",pcVar9,"LIVENESS");
      pVVar6 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar5 * 2;
          if (iVar20 <= (int)uVar5) goto LAB_005a440c;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar20;
      }
LAB_005a440c:
      lVar17 = lVar17 + 1;
      iVar20 = pVVar6->nSize;
      pVVar6->nSize = iVar20 + 1;
      pVVar6->pArray[iVar20] = pcVar11;
      pAVar16 = Aig_And(p_00,(Aig_Obj_t *)((uint)pAVar15 & 1 ^ uVar12),local_58);
      pAVar16 = Aig_Or(p_00,pAVar14,pAVar16);
      Aig_ObjCreateCo(p_00,pAVar16);
      pAVar13 = Aig_And(p_00,pAVar14,pAVar13);
    } while (lVar17 < vLive->nSize);
    iVar19 = iVar19 + (int)lVar17;
    iVar20 = (int)lVar17 + 1;
  }
  pAVar16 = p_00->pConst1;
  if ((vFair == (Vec_Ptr_t *)0x0) || (vFair->nSize == 0)) {
    puts("Circuit without any fairness property");
LAB_005a4746:
    lVar17 = 0;
  }
  else {
    if (vFair->nSize < 1) goto LAB_005a4746;
    lVar17 = 0;
    do {
      pAVar15 = (Aig_Obj_t *)vFair->pArray[lVar17];
      pAVar14 = pAVar15->pFanin0;
      uVar12 = *(ulong *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x28);
      p0 = Aig_ObjCreateCi(p_00);
      pVVar6 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar5 * 2;
          if (iVar4 <= (int)uVar5) goto LAB_005a4588;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar4;
      }
LAB_005a4588:
      iVar4 = pVVar6->nSize;
      pVVar6->nSize = iVar4 + 1;
      pVVar6->pArray[iVar4] = p0;
      uVar5 = getPoIndex(p,pAVar15);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sVar8 = strlen(pcVar11);
      pcVar11 = (char *)malloc(sVar8 + 0xc);
      uVar5 = getPoIndex(p,pAVar15);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_005a48d8;
      pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sprintf(pcVar11,"%s__%s",pcVar9,"FAIRNESS");
      pVVar6 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar5 * 2;
          if (iVar4 <= (int)uVar5) goto LAB_005a46ad;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar6->pArray = ppvVar7;
        }
        pVVar6->nCap = iVar4;
      }
LAB_005a46ad:
      lVar17 = lVar17 + 1;
      iVar4 = pVVar6->nSize;
      pVVar6->nSize = iVar4 + 1;
      pVVar6->pArray[iVar4] = pcVar11;
      pAVar15 = Aig_And(p_00,(Aig_Obj_t *)((uint)pAVar14 & 1 ^ uVar12),local_58);
      pAVar15 = Aig_Or(p_00,p0,pAVar15);
      Aig_ObjCreateCo(p_00,pAVar15);
      pAVar16 = Aig_And(p_00,p0,pAVar16);
    } while (lVar17 < vFair->nSize);
    iVar19 = iVar19 + (int)lVar17;
  }
  iVar4 = (int)lVar17;
  pAVar13 = Aig_And(p_00,pAVar16,(Aig_Obj_t *)((ulong)pAVar13 ^ 1));
  pAVar13 = Aig_And(p_00,pAVar18,pAVar13);
  Aig_ObjPatchFanin0(p_00,local_40,pAVar13);
LAB_005a477a:
  Aig_ManSetRegNum(p_00,iVar19);
  iVar19 = p_00->vCis->nSize;
  p_00->nObjs[2] = iVar19;
  iVar1 = p_00->nRegs;
  if (iVar1 != 0) {
    p_00->nTruePis = iVar19 - iVar1;
  }
  iVar19 = p_00->vCos->nSize;
  p_00->nObjs[3] = iVar19;
  if (iVar1 != 0) {
    p_00->nTruePos = iVar19 - iVar1;
  }
  Aig_ManCleanup(p_00);
  iVar19 = Aig_ManCheck(p_00);
  if (iVar19 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                  ,0x20e,
                  "Aig_Man_t *LivenessToSafetyTransformation(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((mode & 0xfffffffdU) == 0) {
    if (0xfffffffd < (*(uint *)&pAVar10->field_0x18 & 7) - 7) {
      __assert_fail("!Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
    }
    uVar5 = ~p->nTruePis + (pAVar10->field_0).CioId + p_00->nTruePos;
    if (((int)uVar5 < 0) || (p_00->vCos->nSize <= (int)uVar5)) {
LAB_005a48d8:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Aig_Obj_t *)p_00->vCos->pArray[uVar5] != local_48) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                    ,0x212,
                    "Aig_Man_t *LivenessToSafetyTransformation(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nTruePis + 1U != p_00->nTruePis) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                    ,0x213,
                    "Aig_Man_t *LivenessToSafetyTransformation(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p_00->nRegs != iVar20 + iVar4 + p->nRegs * 2) {
      __assert_fail("Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                    ,0x214,
                    "Aig_Man_t *LivenessToSafetyTransformation(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return p_00;
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformation( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
										   Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
	Aig_Man_t * pNew;
	int i, nRegCount;
	Aig_Obj_t * pObjSavePi = NULL;
	Aig_Obj_t *pObjSavedLo = NULL, *pObjSavedLi = NULL;
	Aig_Obj_t *pObj, *pMatch;
	Aig_Obj_t *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL, *pObjSavedLoAndEquality;
	Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
	Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
	Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
	Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
	Aig_Obj_t *pObjOriginalSafetyPropertyOutput;
	Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
	char *nodeName;
	int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0, fairLatch = 0;
	
	vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
	vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

	vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
	vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
	pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l2s") + 1 );
	sprintf(pNew->pName, "%s_%s", pNtk->pName, "l2s");
    pNew->pSpec = NULL;
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

	//****************************************************************
    // Step 3: create true PIs
	//****************************************************************
    Saig_ManForEachPi( p, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecPis, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
		Vec_PtrPush( vecPiNames, nodeName );
	}

	//****************************************************************
	// Step 4: create the special Pi corresponding to SAVE
	//****************************************************************
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
		pObjSavePi = Aig_ObjCreateCi( pNew );
		nodeName = "SAVE_BIERE",
		Vec_PtrPush( vecPiNames, nodeName );
	}
		
	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecLos, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
		Vec_PtrPush( vecLoNames, nodeName );
    }

	//****************************************************************
	// Step 6: create "saved" register output
	//****************************************************************
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
		loCreated++;
		pObjSavedLo = Aig_ObjCreateCi( pNew );
		Vec_PtrPush( vecLos, pObjSavedLo );
		nodeName = "SAVED_LO";
		Vec_PtrPush( vecLoNames, nodeName );
	}

	//****************************************************************
	// Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
	//****************************************************************
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
		pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
		pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
	}

	//********************************************************************
	// Step 8: create internal nodes
	//********************************************************************
    Aig_ManForEachNode( p, pObj, i )
	{
		pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	
	//********************************************************************
	// Step 8.x : create PO for each safety assertions
	// NOTE : Here the output is purposely inverted as it will be thrown to 
	// dprove
	//********************************************************************
	if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
	{
		if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
		{
			pObjAndAcc = Aig_ManConst1( pNew );
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
			}
			pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
		}
		else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
		{
			pObjAndAcc = Aig_ManConst1( pNew );
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
			}
			collectiveAssertSafety = pObjAndAcc;

			pObjAndAcc = Aig_ManConst1( pNew );
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
			{
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
			}
			collectiveAssumeSafety = pObjAndAcc;
			pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
		}
		else
		{
			printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
			pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
		}
	}

	//********************************************************************
	// Step 9: create the safety property output gate for the liveness properties
	// discuss with Sat/Alan for an alternative implementation
	//********************************************************************
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
		pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
	}

	// create register inputs for the original registers
	nRegCount = 0;
	
	Saig_ManForEachLo( p, pObj, i )
	{
		pMatch = Saig_ObjLoToLi( p, pObj );
		Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
		nRegCount++;
		liCopied++;
	}

	// create register input corresponding to the register "saved"
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
		#ifndef DUPLICATE_CKT_DEBUG
			pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
			nRegCount++;
			liCreated++;

			//Changed on October 13, 2009
			//pObjAndAcc = NULL;
			pObjAndAcc = Aig_ManConst1( pNew );

	// create the family of shadow registers, then create the cascade of Xnor and And gates for the comparator 
			Saig_ManForEachLo( p, pObj, i )
			{
				pObjShadowLo = Aig_ObjCreateCi( pNew );

				#ifdef PROPAGATE_NAMES
					Vec_PtrPush( vecLos, pObjShadowLo );
					nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) ) + 10 );
					sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "SHADOW" );
					
					Vec_PtrPush( vecLoNames, nodeName );
				#endif

				pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
				pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
				nRegCount++;
				loCreated++; liCreated++;
		
				pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
				pObjXnor = Aig_Not( pObjXor );
				
				pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
			}

			// create the AND gate whose output will be the signal "looped"
			pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

			// create the master AND gate and corresponding AND and OR logic for the liveness properties
			pObjAndAcc = Aig_ManConst1( pNew );
			if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
			{
				printf("Circuit without any liveness property\n");
			}
			else
			{
				Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
				{
					liveLatch++;
					pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
					pObjShadowLo = Aig_ObjCreateCi( pNew );

					#ifdef PROPAGATE_NAMES
						Vec_PtrPush( vecLos, pObjShadowLo );
						nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
						sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
						Vec_PtrPush( vecLoNames, nodeName );
					#endif

					pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
					pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
					nRegCount++;
					loCreated++; liCreated++;
			
					pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
				}
			}

			pObjLive = pObjAndAcc;
				
			pObjAndAcc = Aig_ManConst1( pNew );
			if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
				printf("Circuit without any fairness property\n");
			else
			{
				Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
				{
					fairLatch++;
					pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
					pObjShadowLo = Aig_ObjCreateCi( pNew );

					#ifdef PROPAGATE_NAMES
						Vec_PtrPush( vecLos, pObjShadowLo );
						nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
						sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "FAIRNESS" );
						Vec_PtrPush( vecLoNames, nodeName );
					#endif

					pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
					pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
					nRegCount++;
					loCreated++; liCreated++;
			
					pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
				}
			}

			pObjFair = pObjAndAcc;
				
			//pObjSafetyGate = Aig_Exor( pNew, Aig_Not(Aig_ManConst1( pNew )), Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) ) );
			//Following is the actual Biere translation
			pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );

			Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
		#endif
	}

	Aig_ManSetRegNum( pNew, nRegCount );

	Aig_ManCiCleanupBiere( pNew );
	Aig_ManCoCleanupBiere( pNew );
	
	Aig_ManCleanup( pNew );
	
	assert( Aig_ManCheck( pNew ) );
	
	if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
	{
			assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
			assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
			assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch );
	}

	return pNew;
}